

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridAxisIrregular::calculatePadding(GridAxisIrregular *this)

{
  pointer puVar1;
  KUINT16 KVar2;
  ulong in_RAX;
  KUINT8 i;
  byte bVar3;
  KUINT16 Padding;
  undefined8 uStack_28;
  
  puVar1 = (this->m_vui16Padding).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_vui16Padding).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar1;
  }
  KVar2 = (this->super_GridAxisRegular).m_ui16NumPoints;
  uStack_28 = in_RAX & 0xffffffffffff;
  for (bVar3 = 0; bVar3 < ((byte)KVar2 & 3); bVar3 = bVar3 + 1) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vui16Padding,(value_type_conflict2 *)((long)&uStack_28 + 6));
  }
  return;
}

Assistant:

void GridAxisIrregular::calculatePadding()
{
    // Calculate padding needed to be on a 64 bit boundary.
    m_vui16Padding.clear();
    KUINT8 NumPadding = m_ui16NumPoints % 4;

    // Add the padding
    KUINT16 Padding = 0;
    for( KUINT8 i = 0; i < NumPadding; ++i )
    {
        m_vui16Padding.push_back( Padding );
    }
}